

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

uint reed_solomon_find_error_locator(correct_reed_solomon *rs,size_t num_erasures)

{
  field_logarithm_t *pfVar1;
  field_element_t *pfVar2;
  byte bVar3;
  field_element_t fVar4;
  ulong uVar5;
  int j_2;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  byte bVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  uint uVar15;
  byte bVar16;
  int j_1;
  int iVar17;
  uint uVar18;
  
  uVar7 = 0;
  memset((rs->error_locator).coeff,0,rs->min_distance + 1);
  *(rs->error_locator).coeff = '\x01';
  (rs->error_locator).order = 0;
  memcpy((rs->last_error_locator).coeff,(rs->error_locator).coeff,rs->min_distance + 1);
  uVar18 = (rs->error_locator).order;
  uVar8 = (ulong)uVar18;
  (rs->last_error_locator).order = uVar18;
  uVar15 = uVar18 - 1;
  bVar11 = 1;
  uVar5 = (ulong)uVar18;
  uVar10 = 1;
  while( true ) {
    uVar12 = 1;
    if (rs->min_distance - num_erasures <= (ulong)uVar18) break;
    bVar16 = rs->syndromes[uVar18];
    uVar9 = uVar15;
    while( true ) {
      if (uVar7 < (uint)uVar12) break;
      uVar14 = (ulong)(rs->error_locator).coeff[uVar12];
      bVar13 = 0;
      if ((uVar14 != 0) && (bVar3 = rs->syndromes[uVar9], bVar13 = 0, bVar3 != 0)) {
        pfVar1 = (rs->field).log;
        bVar13 = (rs->field).exp[(ulong)pfVar1[bVar3] + (ulong)pfVar1[uVar14]];
      }
      bVar16 = bVar16 ^ bVar13;
      uVar12 = (ulong)((uint)uVar12 + 1);
      uVar9 = uVar9 - 1;
    }
    if (bVar16 == 0) {
      uVar10 = uVar10 + 1;
    }
    else if (uVar18 < uVar7 * 2) {
      while (iVar17 = (int)uVar8, -1 < iVar17) {
        uVar5 = (ulong)(rs->last_error_locator).coeff[uVar8];
        pfVar1 = (rs->field).log;
        if (uVar5 == 0) {
          fVar4 = '\0';
        }
        else {
          fVar4 = (rs->field).exp[(ulong)pfVar1[bVar16] + (ulong)pfVar1[uVar5]];
        }
        pfVar2 = (rs->error_locator).coeff;
        bVar13 = pfVar2[uVar10 + iVar17];
        bVar3 = field_div(rs->field,fVar4,bVar11);
        pfVar2[uVar10 + iVar17] = bVar3 ^ bVar13;
        uVar8 = (ulong)(iVar17 - 1);
      }
      uVar9 = (rs->error_locator).order;
      uVar6 = (rs->last_error_locator).order;
      uVar8 = (ulong)uVar6;
      uVar6 = uVar10 + uVar6;
      if (uVar9 < uVar6) {
        uVar9 = uVar6;
      }
      uVar5 = (ulong)uVar9;
      (rs->error_locator).order = uVar9;
      uVar10 = uVar10 + 1;
    }
    else {
      while (iVar17 = (int)uVar8, uVar9 = uVar10, -1 < iVar17) {
        pfVar2 = (rs->last_error_locator).coeff;
        uVar5 = (ulong)pfVar2[uVar8];
        pfVar1 = (rs->field).log;
        if (uVar5 == 0) {
          fVar4 = '\0';
        }
        else {
          fVar4 = (rs->field).exp[(ulong)pfVar1[bVar16] + (ulong)pfVar1[uVar5]];
        }
        fVar4 = field_div(rs->field,fVar4,bVar11);
        pfVar2[uVar10 + iVar17] = fVar4;
        uVar8 = (ulong)(iVar17 - 1);
      }
      while (uVar9 = uVar9 - 1, -1 < (int)uVar9) {
        (rs->last_error_locator).coeff[uVar9 & 0x7fffffff] = '\0';
      }
      uVar8 = 0;
      while( true ) {
        uVar9 = (rs->last_error_locator).order + uVar10;
        uVar5 = (ulong)uVar9;
        if (uVar5 < uVar8) break;
        pfVar2 = (rs->error_locator).coeff;
        bVar11 = pfVar2[uVar8];
        pfVar2[uVar8] = (rs->last_error_locator).coeff[uVar8] ^ bVar11;
        (rs->last_error_locator).coeff[uVar8] = bVar11;
        uVar8 = uVar8 + 1;
      }
      uVar10 = (rs->error_locator).order;
      uVar8 = (ulong)uVar10;
      (rs->error_locator).order = uVar9;
      (rs->last_error_locator).order = uVar10;
      uVar7 = (uVar18 - uVar7) + 1;
      uVar10 = 1;
      bVar11 = bVar16;
    }
    uVar18 = uVar18 + 1;
    uVar15 = uVar15 + 1;
  }
  return (uint)uVar5;
}

Assistant:

static unsigned int reed_solomon_find_error_locator(correct_reed_solomon *rs, size_t num_erasures) {
    unsigned int numerrors = 0;

    memset(rs->error_locator.coeff, 0, (rs->min_distance + 1) * sizeof(field_element_t));

    // initialize to f(x) = 1
    rs->error_locator.coeff[0] = 1;
    rs->error_locator.order = 0;

    memcpy(rs->last_error_locator.coeff, rs->error_locator.coeff, (rs->min_distance + 1) * sizeof(field_element_t));
    rs->last_error_locator.order = rs->error_locator.order;

    field_element_t discrepancy;
    field_element_t last_discrepancy = 1;
    unsigned int delay_length = 1;

    for (unsigned int i = rs->error_locator.order; i < rs->min_distance - num_erasures; i++) {
        discrepancy = rs->syndromes[i];
        for (unsigned int j = 1; j <= numerrors; j++) {
            discrepancy = field_add(rs->field, discrepancy,
                                    field_mul(rs->field, rs->error_locator.coeff[j], rs->syndromes[i - j]));
        }

        if (!discrepancy) {
            // our existing LFSR describes the new syndrome as well
            // leave it as-is but update the number of delay elements
            //   so that if a discrepancy occurs later we can eliminate it
            delay_length++;
            continue;
        }

        if (2 * numerrors <= i) {
            // there's a discrepancy, but we still have room for more taps
            // lengthen LFSR by one tap and set weight to eliminate discrepancy

            // shift the last locator by the delay length, multiply by discrepancy,
            //   and divide by the last discrepancy
            // we move down because we're shifting up, and this prevents overwriting
            for (int j = rs->last_error_locator.order; j >= 0; j--) {
                // the bounds here will be ok since we have a headroom of numerrors
                rs->last_error_locator.coeff[j + delay_length] = field_div(
                    rs->field, field_mul(rs->field, rs->last_error_locator.coeff[j], discrepancy), last_discrepancy);
            }
            for (int j = delay_length - 1; j >= 0; j--) {
                rs->last_error_locator.coeff[j] = 0;
            }

            // locator = locator - last_locator
            // we will also update last_locator to be locator before this loop takes place
            field_element_t temp;
            for (int j = 0; j <= (rs->last_error_locator.order + delay_length); j++) {
                temp = rs->error_locator.coeff[j];
                rs->error_locator.coeff[j] =
                    field_add(rs->field, rs->error_locator.coeff[j], rs->last_error_locator.coeff[j]);
                rs->last_error_locator.coeff[j] = temp;
            }
            unsigned int temp_order = rs->error_locator.order;
            rs->error_locator.order = rs->last_error_locator.order + delay_length;
            rs->last_error_locator.order = temp_order;

            // now last_locator is locator before we started,
            //   and locator is (locator - (discrepancy/last_discrepancy) * x^(delay_length) * last_locator)

            numerrors = i + 1 - numerrors;
            last_discrepancy = discrepancy;
            delay_length = 1;
            continue;
        }

        // no more taps
        // unlike the previous case, we are preserving last locator,
        //    but we'll update locator as before
        // we're basically flattening the two loops from the previous case because
        //    we no longer need to update last_locator
        for (int j = rs->last_error_locator.order; j >= 0; j--) {
            rs->error_locator.coeff[j + delay_length] =
                field_add(rs->field, rs->error_locator.coeff[j + delay_length],
                          field_div(rs->field, field_mul(rs->field, rs->last_error_locator.coeff[j], discrepancy),
                                    last_discrepancy));
        }
        rs->error_locator.order = (rs->last_error_locator.order + delay_length > rs->error_locator.order)
                                      ? rs->last_error_locator.order + delay_length
                                      : rs->error_locator.order;
        delay_length++;
    }
    return rs->error_locator.order;
}